

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.cc
# Opt level: O2

void __thiscall xemmai::t_directory::t_directory(t_directory *this,wstring_view a_path)

{
  undefined8 *puVar1;
  path pStack_68;
  string_type local_40;
  
  puVar1 = (undefined8 *)__tls_get_addr(&PTR_00126ce0);
  (this->super_t_owned).v_owner = (t_queue<128UL> *)*puVar1;
  xemmai::portable::f_convert_abi_cxx11_(&local_40,a_path._M_len,a_path._M_str);
  std::filesystem::__cxx11::path::path(&pStack_68,&local_40,auto_format);
  std::filesystem::__cxx11::directory_iterator::directory_iterator(&this->v_i,&pStack_68);
  std::filesystem::__cxx11::path::~path(&pStack_68);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

t_directory(std::wstring_view a_path) : v_i(portable::f_convert(a_path))
	{
	}